

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::TypeInNameSpace
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,Namespace *ns,string *name)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_48 [8];
  string qualified;
  string *name_local;
  Namespace *ns_local;
  KotlinKMPGenerator *this_local;
  
  qualified.field_2._8_8_ = name;
  IdlNamer::Namespace_abi_cxx11_((string *)local_48,&this->namer_,ns);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &(this->super_BaseGenerator).qualifying_separator_);
    std::operator+(__return_storage_ptr__,&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   qualified.field_2._8_8_);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)qualified.field_2._8_8_)
    ;
  }
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string TypeInNameSpace(const Namespace *ns,
                              const std::string &name = "") const {
    auto qualified = namer_.Namespace(*ns);
    return qualified.empty() ? name : qualified + qualifying_separator_ + name;
  }